

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getline.c
# Opt level: O1

void hooked_curses_getlin(char *query,char *buf,getlin_hook_proc hook,void *hook_proc_arg)

{
  int iVar1;
  bool bVar2;
  ulong uVar3;
  char cVar4;
  undefined4 uVar5;
  wchar_t wVar6;
  gamewin *gw;
  WINDOW *pWVar7;
  size_t sVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  wchar_t output_count;
  char **output;
  wchar_t local_3c;
  char **local_38;
  
  uVar5 = curs_set(1);
  ui_wrap_text(L'L',query,&local_3c,&local_38);
  ui_free_wrap(local_38);
  gw = alloc_gamewin(L'\x18');
  pWVar7 = newdialog(local_3c + L'\x03',L'P');
  gw->win = pWVar7;
  gw->draw = draw_getline;
  gw->resize = resize_getline;
  gw[1].draw = (_func_void_gamewin_ptr *)buf;
  gw[1].resize = (_func_void_gamewin_ptr *)query;
  *buf = '\0';
  cVar4 = '\0';
  bVar2 = false;
  uVar3 = 0;
LAB_00109b6a:
  do {
    uVar10 = uVar3;
    draw_getline(gw);
    wVar6 = nh_wgetch(gw->win);
    uVar3 = uVar10;
    if (wVar6 < L'Ą') {
      if (wVar6 == L'\x7f') {
switchD_00109b9f_caseD_107:
        if (*(int *)&gw[1].win == 0) goto LAB_00109b6a;
        *(int *)&gw[1].win = *(int *)&gw[1].win + -1;
LAB_00109c0e:
        uVar3 = 0;
        if (uVar10 == 0) goto LAB_00109b6a;
        uVar10 = uVar10 - 1;
        iVar1 = *(int *)&gw[1].win;
        sVar8 = strlen(buf);
        if (iVar1 <= (int)sVar8) {
          lVar11 = 0;
          do {
            buf[lVar11 + iVar1] = buf[lVar11 + (long)iVar1 + 1];
            lVar11 = lVar11 + 1;
          } while (((int)sVar8 - iVar1) + 1 != (int)lVar11);
        }
      }
      else {
        if (wVar6 != L'\r') {
          if (wVar6 != L'\x1b') goto switchD_00109b9f_default;
          buf[0] = '\x1b';
          buf[1] = '\0';
        }
LAB_00109c68:
        bVar2 = true;
      }
    }
    else if (wVar6 < L'Ŋ') {
      switch(wVar6) {
      case L'Ą':
        if (0 < *(int *)&gw[1].win) {
          *(int *)&gw[1].win = *(int *)&gw[1].win + -1;
        }
        break;
      case L'ą':
        if ((ulong)(long)*(int *)&gw[1].win < uVar10) {
          *(int *)&gw[1].win = *(int *)&gw[1].win + 1;
        }
        break;
      case L'Ć':
        *(undefined4 *)&gw[1].win = 0;
        break;
      case L'ć':
        goto switchD_00109b9f_caseD_107;
      default:
switchD_00109b9f_default:
        if ((uint)(wVar6 + L'\xffffff81') < 0xffffffa1) goto LAB_00109b6a;
        iVar1 = *(int *)&gw[1].win;
        lVar11 = (long)iVar1;
        if (0xfd < lVar11) goto LAB_00109b6a;
        sVar8 = strlen(buf);
        if (iVar1 <= (int)sVar8) {
          lVar9 = (long)(int)sVar8 + 1;
          do {
            buf[lVar9] = buf[lVar9 + -1];
            lVar9 = lVar9 + -1;
          } while (lVar11 < lVar9);
        }
        buf[lVar11] = (char)wVar6;
        lVar11 = (long)*(int *)&gw[1].win + 1;
        *(int *)&gw[1].win = (int)lVar11;
        if (hook == (getlin_hook_proc)0x0) {
          uVar10 = uVar10 + 1;
          cVar4 = '\0';
        }
        else {
          if (cVar4 != '\0') {
            buf[lVar11] = '\0';
          }
          cVar4 = (*hook)(buf,hook_proc_arg);
          uVar10 = strlen(buf);
        }
      }
    }
    else {
      if (wVar6 == L'Ŋ') goto LAB_00109c0e;
      if (wVar6 == L'ŗ') goto LAB_00109c68;
      if (wVar6 != L'Ũ') goto switchD_00109b9f_default;
      *(int *)&gw[1].win = (int)uVar10;
    }
    uVar3 = uVar10;
    if (bVar2) {
      curs_set(uVar5);
      delwin(gw->win);
      delete_gamewin(gw);
      redraw_game_windows();
      return;
    }
  } while( true );
}

Assistant:

static void hooked_curses_getlin(const char *query, char *buf,
		       getlin_hook_proc hook, void *hook_proc_arg)
{
    struct gamewin *gw;
    struct win_getline *gldat;
    int height, width, key, prev_curs;
    size_t len = 0;
    nh_bool done = FALSE;
    nh_bool autocomplete = FALSE;
    char **output;
    int output_count;

    prev_curs = curs_set(1);

    /* wrap text just for determining dimensions */
    ui_wrap_text(COLNO - 4, query, &output_count, &output);
    ui_free_wrap(output);
    height = output_count + 3;
    width = COLNO;

    gw = alloc_gamewin(sizeof(struct win_getline));
    gw->win = newdialog(height, width);
    gw->draw = draw_getline;
    gw->resize = resize_getline;
    gldat = (struct win_getline *)gw->extra;
    gldat->buf = buf;
    gldat->query = query;
    
    buf[0] = 0;
    while (!done) {
	draw_getline(gw);
	key = nh_wgetch(gw->win);
	
	switch (key) {
	    case KEY_ESC:
		buf[0] = (char)key;
		buf[1] = 0;
		done = TRUE;
		break;
		
	    case KEY_ENTER:
	    case '\r':
		done = TRUE;
		break;

	    case KEY_BACKSPACE: /* different terminals send different codes... */
	    case KEY_BACKDEL:
		if (gldat->pos == 0) continue;
		gldat->pos--;
		/* fall through */
	    case KEY_DC:
		if (len == 0) continue;
		len--;
		buf_delete(buf, gldat->pos);
		break;
		
	    case KEY_LEFT:
		if (gldat->pos > 0) gldat->pos--;
		break;
		
	    case KEY_RIGHT:
		if (gldat->pos < len) gldat->pos++;
		break;
		
	    case KEY_HOME:
		gldat->pos = 0;
		break;
		
	    case KEY_END:
		gldat->pos = len;
		break;
		
	    default:
		if (' ' > (unsigned) key || (unsigned)key >= 128 || 
		    key == KEY_BACKDEL || gldat->pos >= BUFSZ-2)
		    continue;
		buf_insert(buf, gldat->pos, key);
		gldat->pos++;
		len++;
		
		if (hook) {
		    if (autocomplete)
			/* discard previous completion before looking for a new one */
			buf[gldat->pos] = '\0';
		    
		    autocomplete = (*hook)(buf, hook_proc_arg);
		    len = strlen(buf); /* (*hook) may modify buf */
		} else
		    autocomplete = FALSE;
		
		break;
	}
    }
    
    curs_set(prev_curs);
    
    delwin(gw->win);
    delete_gamewin(gw);
    redraw_game_windows();
}